

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O3

void __thiscall CDoodadsMapper::AnalyzeGameLayer(CDoodadsMapper *this)

{
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_00;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_01;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_02;
  CLayerGame *pCVar1;
  CTile *pCVar2;
  array<int,_allocator_default<int>_> *paVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
  *this_03;
  int iVar7;
  int iVar8;
  bool bVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  int local_94;
  int local_7c;
  int local_4c;
  array<int,_allocator_default<int>_> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_FloorIDs;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_FloorIDs).list);
  (this->m_FloorIDs).list_size = 1;
  paVar3 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_FloorIDs).list = paVar3;
  (this->m_FloorIDs).num_elements = 0;
  this_01 = &this->m_CeilingIDs;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_CeilingIDs).list);
  (this->m_CeilingIDs).list_size = 1;
  paVar3 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_CeilingIDs).list = paVar3;
  (this->m_CeilingIDs).num_elements = 0;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_RightWallIDs).list);
  (this->m_RightWallIDs).list_size = 1;
  paVar3 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_RightWallIDs).list = paVar3;
  (this->m_RightWallIDs).num_elements = 0;
  allocator_default<array<int,_allocator_default<int>_>_>::free_array((this->m_LeftWallIDs).list);
  (this->m_LeftWallIDs).list_size = 1;
  paVar3 = allocator_default<array<int,_allocator_default<int>_>_>::alloc_array(1);
  (this->m_LeftWallIDs).list = paVar3;
  local_94 = 0;
  (this->m_LeftWallIDs).num_elements = 0;
  pCVar1 = (((this->super_IAutoMapper).m_pEditor)->m_Map).m_pGameLayer;
  iVar5 = (pCVar1->super_CLayerTiles).m_Height;
  if (iVar5 < 3) {
    iVar7 = (pCVar1->super_CLayerTiles).m_Width;
  }
  else {
    iVar7 = (pCVar1->super_CLayerTiles).m_Width;
    iVar6 = 0;
    iVar8 = 1;
    do {
      if (2 < iVar7) {
        lVar10 = 1;
        bVar4 = false;
        bVar9 = false;
        do {
          pCVar2 = (pCVar1->super_CLayerTiles).m_pTiles;
          lVar12 = iVar7 * iVar8 + lVar10;
          if (pCVar2[lVar12].m_Index == '\x01') {
            iVar5 = (int)lVar10;
            bVar13 = (byte)(pCVar2[iVar7 * (iVar8 + -1) + iVar5].m_Index + 0x40) < 0x41;
            if (bVar13) {
              iVar7 = iVar7 * iVar8 + iVar5;
              if (bVar4) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar7);
                array<int,_allocator_default<int>_>::add(this_00->list + iVar6,(int *)&local_48);
              }
              else {
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = iVar7;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                iVar6 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                        ::add(this_00,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
              }
            }
            bVar4 = bVar13;
            if ((pCVar2[lVar12].m_Index == '\x01') &&
               (iVar7 = (pCVar1->super_CLayerTiles).m_Width,
               (byte)((pCVar1->super_CLayerTiles).m_pTiles[iVar7 * (iVar8 + 1) + lVar10].m_Index +
                     0x40) < 0x41)) {
              if (bVar9) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar7 * iVar8 + iVar5);
                array<int,_allocator_default<int>_>::add(this_01->list + local_94,(int *)&local_48);
                bVar9 = true;
              }
              else {
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = iVar7 * iVar8 + iVar5;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                local_94 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           ::add(this_01,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
                bVar9 = true;
              }
            }
            else {
              bVar9 = false;
            }
          }
          else {
            bVar9 = false;
            bVar4 = false;
          }
          iVar7 = (pCVar1->super_CLayerTiles).m_Width;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < iVar7 + -1);
        iVar5 = (pCVar1->super_CLayerTiles).m_Height;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar5 + -1);
  }
  this_02 = &this->m_RightWallIDs;
  this_03 = &this->m_LeftWallIDs;
  if (2 < iVar7) {
    local_7c = 0;
    local_94 = 0;
    iVar8 = 1;
    do {
      iVar6 = iVar8 + 1;
      if (2 < iVar5) {
        iVar7 = 1;
        bVar9 = false;
        bVar4 = false;
        do {
          pCVar2 = (pCVar1->super_CLayerTiles).m_pTiles;
          iVar5 = (pCVar1->super_CLayerTiles).m_Width * iVar7;
          iVar11 = iVar5 + iVar8;
          if (pCVar2[iVar11].m_Index == '\x01') {
            bVar13 = (byte)(pCVar2[iVar5 + iVar6].m_Index + 0x40) < 0x41;
            if (bVar13) {
              if (bVar4) {
                local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar11);
                array<int,_allocator_default<int>_>::add(this_02->list + local_94,(int *)&local_48);
              }
              else {
                local_48.list_size = 1;
                local_48.list = (int *)operator_new__(4);
                local_48.num_elements = 0;
                local_4c = iVar11;
                array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
                local_94 = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                           ::add(this_02,&local_48);
                if (local_48.list != (int *)0x0) {
                  operator_delete__(local_48.list);
                }
              }
            }
            bVar4 = bVar13;
            if ((pCVar2[iVar11].m_Index != '\x01') ||
               (iVar5 = (pCVar1->super_CLayerTiles).m_Width * iVar7,
               0x40 < (byte)((pCVar1->super_CLayerTiles).m_pTiles[iVar8 + -1 + iVar5].m_Index + 0x40
                            ))) goto LAB_0018f9f2;
            if (bVar9) {
              local_48.list = (int *)CONCAT44(local_48.list._4_4_,iVar5 + iVar8);
              array<int,_allocator_default<int>_>::add(this_03->list + local_7c,(int *)&local_48);
              bVar9 = true;
            }
            else {
              local_48.list_size = 1;
              local_48.list = (int *)operator_new__(4);
              local_48.num_elements = 0;
              local_4c = iVar5 + iVar8;
              array<int,_allocator_default<int>_>::add(&local_48,&local_4c);
              local_7c = array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                         ::add(this_03,&local_48);
              if (local_48.list != (int *)0x0) {
                operator_delete__(local_48.list);
              }
              bVar9 = true;
            }
          }
          else {
            bVar4 = false;
LAB_0018f9f2:
            bVar9 = false;
          }
          iVar7 = iVar7 + 1;
          iVar5 = (pCVar1->super_CLayerTiles).m_Height;
        } while (iVar7 < iVar5 + -1);
        iVar7 = (pCVar1->super_CLayerTiles).m_Width;
      }
      iVar8 = iVar6;
    } while (iVar6 < iVar7 + -1);
  }
  iVar5 = (this->m_FloorIDs).num_elements;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      if (this_00->list[iVar7].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_00,iVar7);
        iVar7 = iVar7 + -1;
        iVar5 = (this->m_FloorIDs).num_elements;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  iVar5 = (this->m_CeilingIDs).num_elements;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      if (this_01->list[iVar7].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_01,iVar7);
        iVar7 = iVar7 + -1;
        iVar5 = (this->m_CeilingIDs).num_elements;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  iVar5 = (this->m_RightWallIDs).num_elements;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      if (this_02->list[iVar7].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_02,iVar7);
        iVar7 = iVar7 + -1;
        iVar5 = (this->m_RightWallIDs).num_elements;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  iVar5 = (this->m_LeftWallIDs).num_elements;
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      if (this_03->list[iVar7].num_elements < 3) {
        array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
        ::remove_index_fast(this_03,iVar7);
        iVar7 = iVar7 + -1;
        iVar5 = (this->m_LeftWallIDs).num_elements;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < iVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDoodadsMapper::AnalyzeGameLayer()
{
	// the purpose of this is to detect game layer collision's edges to place doodads according to them

	// clear existing edges
	m_FloorIDs.clear();
	m_CeilingIDs.clear();
	m_RightWallIDs.clear();
	m_LeftWallIDs.clear();

	CLayerGame *pLayer = m_pEditor->m_Map.m_pGameLayer;

	bool FloorKeepChaining = false;
	bool CeilingKeepChaining = false;
	int FloorChainID = 0;
	int CeilingChainID = 0;

	// floors and ceilings
	// browse up to down
	for(int y = 1; y < pLayer->m_Height-1; y++)
	{
		FloorKeepChaining = false;
		CeilingKeepChaining = false;

		for(int x = 1; x < pLayer->m_Width-1; x++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			// empty, skip
			if(pTile->m_Index == 0)
			{
				FloorKeepChaining = false;
				CeilingKeepChaining = false;
				continue;
			}

			// check up
			int CheckIndex = (y-1)*pLayer->m_Width+x;

			// add a floor part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!FloorKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					FloorChainID = m_FloorIDs.add(aChain);
					FloorKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_FloorIDs[FloorChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				FloorKeepChaining = false;

			// check down
			CheckIndex = (y+1)*pLayer->m_Width+x;

			// add a ceiling part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!CeilingKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					CeilingChainID = m_CeilingIDs.add(aChain);
					CeilingKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_CeilingIDs[CeilingChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				CeilingKeepChaining = false;
		}
	}

	bool RWallKeepChaining = false;
	bool LWallKeepChaining = false;
	int RWallChainID = 0;
	int LWallChainID = 0;

	// walls
	// browse left to right
	for(int x = 1; x < pLayer->m_Width-1; x++)
	{
		RWallKeepChaining = false;
		LWallKeepChaining = false;

		for(int y = 1; y < pLayer->m_Height-1; y++)
		{
			CTile *pTile = &(pLayer->m_pTiles[y*pLayer->m_Width+x]);

			if(pTile->m_Index == 0)
			{
				RWallKeepChaining = false;
				LWallKeepChaining = false;
				continue;
			}

			// check right
			int CheckIndex = y*pLayer->m_Width+(x+1);

			// add a right wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!RWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					RWallChainID = m_RightWallIDs.add(aChain);
					RWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_RightWallIDs[RWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				RWallKeepChaining = false;

			// check left
			CheckIndex = y*pLayer->m_Width+(x-1);

			// add a left wall part
			if(pTile->m_Index == 1 && (pLayer->m_pTiles[CheckIndex].m_Index == 0 || pLayer->m_pTiles[CheckIndex].m_Index > ENTITY_OFFSET))
			{
				// create an new chain
				if(!LWallKeepChaining)
				{
					array<int> aChain;
					aChain.add(y*pLayer->m_Width+x);
					LWallChainID = m_LeftWallIDs.add(aChain);
					LWallKeepChaining = true;
				}
				else
				{
					// keep chaining
					m_LeftWallIDs[LWallChainID].add(y*pLayer->m_Width+x);
				}
			}
			else
				LWallKeepChaining = false;
		}
	}

	// clean up too small chains
	for(int i = 0; i < m_FloorIDs.size(); i++)
	{
		if(m_FloorIDs[i].size() < 3)
		{
			m_FloorIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_CeilingIDs.size(); i++)
	{
		if(m_CeilingIDs[i].size() < 3)
		{
			m_CeilingIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_RightWallIDs.size(); i++)
	{
		if(m_RightWallIDs[i].size() < 3)
		{
			m_RightWallIDs.remove_index_fast(i);
			i--;
		}
	}

	for(int i = 0; i < m_LeftWallIDs.size(); i++)
	{
		if(m_LeftWallIDs[i].size() < 3)
		{
			m_LeftWallIDs.remove_index_fast(i);
			i--;
		}
	}
}